

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O2

void __thiscall UnifiedRegex::RegexStats::Add(RegexStats *this,RegexStats *other)

{
  uint64 uVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    this->phaseTicks[lVar2 + -1] = this->phaseTicks[lVar2 + -1] + other->phaseTicks[lVar2 + -1];
  }
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    this->useCounts[lVar2] = this->useCounts[lVar2] + other->useCounts[lVar2];
  }
  uVar1 = other->numCompares;
  this->inputLength = this->inputLength + other->inputLength;
  this->numCompares = this->numCompares + uVar1;
  uVar1 = other->numPops;
  this->numPushes = other->numPushes + this->numPushes;
  this->numPops = uVar1 + this->numPops;
  if (this->stackHWM < other->stackHWM) {
    this->stackHWM = other->stackHWM;
  }
  this->numInsts = this->numInsts + other->numInsts;
  return;
}

Assistant:

void RegexStats::Add(RegexStats* other)
    {
        for (int i = 0; i < NumPhases; i++)
            phaseTicks[i] += other->phaseTicks[i];
        for (int i = 0; i < NumUses; i++)
            useCounts[i] += other->useCounts[i];
        inputLength += other->inputLength;
        numCompares += other->numCompares;
        numPushes += other->numPushes;
        numPops += other->numPops;
        if (other->stackHWM > stackHWM)
            stackHWM = other->stackHWM;
        numInsts += other->numInsts;
    }